

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_NodalProjector.cpp
# Opt level: O2

void __thiscall
Hydro::NodalProjector::NodalProjector
          (NodalProjector *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_vel
          ,Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_sigma,
          Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,LPInfo *a_lpinfo,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_S_cc,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_S_nd)

{
  this->m_has_rhs = false;
  this->m_has_alpha = false;
  this->m_need_bcs = true;
  this->m_verbose = 0;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (&(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             &a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  (this->m_ebfactory).
  super_vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  .
  super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ebfactory).
  super_vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  .
  super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ebfactory).
  super_vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  .
  super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&(this->m_vel).super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
             &a_vel->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>);
  (this->m_alpha).super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_alpha).super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fluxes).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_alpha).super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fluxes).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fluxes).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&(this->m_S_cc).super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
             &a_S_cc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>);
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            (&(this->m_sigma).
              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>,
             &a_sigma->
              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>);
  (this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_const_sigma = 0.0;
  (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            (&(this->m_S_nd).
              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>,
             &a_S_nd->
              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>);
  (this->m_ref_ratio).vect[0] = 0;
  (this->m_ref_ratio).vect[1] = 0;
  (this->m_ref_ratio).vect[2] = 0;
  (this->m_linop)._M_t.
  super___uniq_ptr_impl<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLNodeLaplacian_*,_std::default_delete<amrex::MLNodeLaplacian>_>.
  super__Head_base<0UL,_amrex::MLNodeLaplacian_*,_false>._M_head_impl = (MLNodeLaplacian *)0x0;
  (this->m_mlmg)._M_t.super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
  super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl = (MLMG *)0x0;
  amrex::BoxArray::BoxArray(&this->m_fine_grids);
  this->m_sync_resid_crse = (MultiFab *)0x0;
  this->m_sync_resid_fine = (MultiFab *)0x0;
  define(this,a_lpinfo);
  return;
}

Assistant:

NodalProjector::NodalProjector ( const amrex::Vector<amrex::MultiFab*>&       a_vel,
                                 const amrex::Vector<const amrex::MultiFab*>& a_sigma,
                                 const amrex::Vector<amrex::Geometry>&        a_geom,
                                 const LPInfo&                                a_lpinfo,
                                 const amrex::Vector<amrex::MultiFab*>&       a_S_cc,
                                 const amrex::Vector<const amrex::MultiFab*>& a_S_nd )
    : m_geom(a_geom),
      m_vel(a_vel),
      m_S_cc(a_S_cc),
      m_sigma(a_sigma),
      m_S_nd(a_S_nd)
{
    define(a_lpinfo);
}